

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalbackingstore.cpp
# Opt level: O0

void __thiscall
QMinimalBackingStore::flush
          (QMinimalBackingStore *this,QWindow *window,QRegion *region,QPoint *offset)

{
  QMessageLogger *in_RCX;
  QDebug *in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString filename;
  undefined4 in_stack_ffffffffffffff48;
  int base;
  undefined8 in_stack_ffffffffffffff50;
  int line;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff98;
  QDebug local_48 [14];
  QChar local_3a [13];
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[1].d.size & 1) != 0) {
    local_20[0] = -0x56;
    local_20[1] = -0x56;
    local_20[2] = -0x56;
    local_20[3] = -0x56;
    local_20[4] = -0x56;
    local_20[5] = -0x56;
    local_20[6] = -0x56;
    local_20[7] = -0x56;
    local_20[8] = -0x56;
    local_20[9] = -0x56;
    local_20[10] = -0x56;
    local_20[0xb] = -0x56;
    local_20[0xc] = -0x56;
    local_20[0xd] = -0x56;
    local_20[0xe] = -0x56;
    local_20[0xf] = -0x56;
    local_20[0x10] = -0x56;
    local_20[0x11] = -0x56;
    local_20[0x12] = -0x56;
    local_20[0x13] = -0x56;
    local_20[0x14] = -0x56;
    local_20[0x15] = -0x56;
    local_20[0x16] = -0x56;
    local_20[0x17] = -0x56;
    QString::QString(in_RDI,in_stack_ffffffffffffff88);
    base = flush::c;
    flush::c = flush::c + 1;
    QChar::QChar<char16_t,_true>(local_3a,L'0');
    QString::arg<int,_true>
              (in_RDI,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(int)in_stack_ffffffffffffff50
               ,base,(QChar)(char16_t)((ulong)in_RDX >> 0x30));
    line = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    QString::~QString((QString *)0x1066ae);
    QMessageLogger::QMessageLogger
              (in_RCX,(char *)in_RDI,line,(char *)CONCAT44(base,in_stack_ffffffffffffff48));
    QMessageLogger::debug();
    QDebug::operator<<(in_RDX,in_stack_ffffffffffffff98);
    QString::toLocal8Bit((QString *)in_RDX);
    QByteArray::constData((QByteArray *)0x106702);
    QDebug::operator<<(in_RDX,in_stack_ffffffffffffff98);
    QByteArray::~QByteArray((QByteArray *)0x106719);
    QDebug::~QDebug(local_48);
    QImage::save((QString *)&(in_RDI->d).size,local_20,0);
    QString::~QString((QString *)0x10674f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMinimalBackingStore::flush(QWindow *window, const QRegion &region, const QPoint &offset)
{
    Q_UNUSED(window);
    Q_UNUSED(region);
    Q_UNUSED(offset);

    if (mDebug) {
        static int c = 0;
        QString filename = QString("output%1.png").arg(c++, 4, 10, QChar(u'0'));
        qDebug() << "QMinimalBackingStore::flush() saving contents to" << filename.toLocal8Bit().constData();
        mImage.save(filename);
    }
}